

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O0

void pnga_print_distribution(int fstyle,Integer g_a)

{
  int iVar1;
  Integer IVar2;
  Integer IVar3;
  char *pre;
  long lVar4;
  size_t sVar5;
  uint in_ESI;
  int in_EDI;
  char *ptr;
  Integer idx;
  Integer j_1;
  Integer ok;
  Integer index [7];
  Integer proc_idx [7];
  Integer proc_grid [7];
  Integer nblocks_1 [7];
  Integer j;
  Integer total;
  Integer nblocks [7];
  int local_sync_end;
  int local_sync_begin;
  char *name;
  char ctype [128];
  char msg [100];
  Integer hi [7];
  Integer lo [7];
  Integer dims [7];
  Integer nproc;
  Integer type;
  Integer proc;
  Integer i;
  Integer ndim;
  char *in_stack_fffffffffffffc70;
  char *post;
  Integer *in_stack_fffffffffffffc78;
  Integer *in_stack_fffffffffffffc80;
  uint in_stack_fffffffffffffc8c;
  char *local_368;
  Integer *in_stack_fffffffffffffca0;
  long in_stack_fffffffffffffca8;
  ulong uVar6;
  Integer in_stack_fffffffffffffcb0;
  long lVar7;
  long local_348 [8];
  long local_308 [8];
  long local_2c8 [8];
  long local_288 [8];
  ulong local_248;
  long local_240;
  long local_238 [8];
  int iVar8;
  char *in_stack_fffffffffffffe10;
  char local_1e8 [80];
  char **in_stack_fffffffffffffe68;
  Integer in_stack_fffffffffffffe70;
  Integer *in_stack_fffffffffffffe78;
  Integer *in_stack_fffffffffffffe80;
  Integer *in_stack_fffffffffffffe88;
  Integer in_stack_fffffffffffffe90;
  char local_168 [104];
  Integer IStack_100;
  long local_f8 [7];
  Integer IStack_c0;
  long local_b8 [6];
  Integer *in_stack_ffffffffffffff78;
  Integer *in_stack_ffffffffffffff80;
  Integer in_stack_ffffffffffffff88;
  Integer in_stack_ffffffffffffff90;
  long local_30;
  ulong local_28;
  Integer *local_20;
  long local_18;
  
  IVar2 = pnga_nnodes();
  iVar8 = _ga_sync_end;
  iVar1 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar1 != 0) {
    pnga_sync();
  }
  IVar3 = pnga_nodeid();
  if (IVar3 == 0) {
    pnga_inquire(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 in_stack_fffffffffffffe78);
    pnga_inquire_name(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    in_stack_fffffffffffffc8c = in_stack_fffffffffffffc8c & 0xffffff;
    printf("Array Handle=%d Name:\'%s\' ",(ulong)in_ESI,in_stack_fffffffffffffe10);
    printf("Data Type:");
    pre = (char *)(local_30 + -0x3e9);
    switch(pre) {
    case (char *)0x0:
      printf("integer");
      break;
    case (char *)0x1:
      printf("long");
      break;
    case (char *)0x2:
      printf("float");
      break;
    case (char *)0x3:
      printf("double");
      break;
    default:
      pnga_error(in_stack_fffffffffffffe10,CONCAT44(iVar1,iVar8));
      break;
    case (char *)0x5:
      printf("float (single) complex");
      break;
    case (char *)0x6:
      printf("double complex");
      break;
    case (char *)0xf:
      printf("long long");
    }
    printf("\nArray Dimensions:");
    if (in_EDI == 0) {
      for (local_20 = (Integer *)(local_18 + -1); 0 < (long)local_20;
          local_20 = (Integer *)((long)local_20 + -1)) {
        printf("%ldx",*(undefined8 *)(&stack0xffffffffffffff88 + (long)local_20 * 8));
      }
      printf("%ld\n",in_stack_ffffffffffffff88);
    }
    else {
      for (local_20 = (Integer *)0x0; (long)local_20 < local_18 + -1;
          local_20 = (Integer *)((long)local_20 + 1)) {
        printf("%ldx",*(undefined8 *)(&stack0xffffffffffffff88 + (long)local_20 * 8));
      }
      printf("%ld\n",*(undefined8 *)(&stack0xffffffffffffff88 + (local_18 + -1) * 8));
    }
    pnga_get_distribution_type((Integer)in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78)
    ;
    iVar1 = strcmp(local_1e8,"regular");
    if (iVar1 == 0) {
      for (local_28 = 0; (long)local_28 < IVar2; local_28 = local_28 + 1) {
        pnga_distribution(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                          in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        sprintf(local_168,"Process=%d\t owns array section: ",local_28 & 0xffffffff);
        if (in_EDI == 0) {
          for (local_20 = (Integer *)0x0; in_stack_fffffffffffffc80 = local_20,
              (long)local_20 < local_18 / 2; local_20 = (Integer *)((long)local_20 + 1)) {
            swap(&IStack_c0 + (long)local_20 + 1,&IStack_c0 + (local_18 - (long)local_20));
            swap(&IStack_100 + (long)local_20 + 1,&IStack_100 + (local_18 - (long)local_20));
          }
          for (local_20 = (Integer *)0x0; (long)local_20 < local_18;
              local_20 = (Integer *)((long)local_20 + 1)) {
            (&IStack_c0)[(long)local_20 + 1] = (&IStack_c0)[(long)local_20 + 1] + -1;
          }
          for (local_20 = (Integer *)0x0; (long)local_20 < local_18;
              local_20 = (Integer *)((long)local_20 + 1)) {
            (&IStack_100)[(long)local_20 + 1] = (&IStack_100)[(long)local_20 + 1] + -1;
          }
        }
        gai_print_range(pre,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80,
                        in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
      }
    }
    else {
      iVar1 = strcmp(local_1e8,"block_cyclic");
      if (iVar1 == 0) {
        pnga_nblock((Integer)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        printf("\nDistribution is block-cyclic\n");
        local_240 = 1;
        for (local_20 = (Integer *)0x0; (long)local_20 < local_18;
            local_20 = (Integer *)((long)local_20 + 1)) {
          local_240 = local_238[(long)local_20] * local_240;
        }
        printf("\nTotal of %ld blocks on %ld processors\n",local_240,IVar2);
        for (local_20 = (Integer *)0x0; (long)local_20 < IVar2;
            local_20 = (Integer *)((long)local_20 + 1)) {
          printf("Distribution on process %ld\n",local_20);
          for (local_248 = (ulong)local_20; (long)local_248 < local_240;
              local_248 = IVar2 + local_248) {
            pnga_distribution(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                              in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
            sprintf(local_168,"  Block=%d\t corresponds to array section: ",local_248 & 0xffffffff);
            if (in_EDI == 0) {
              for (local_20 = (Integer *)0x0; in_stack_fffffffffffffc78 = local_20,
                  (long)local_20 < local_18 / 2; local_20 = (Integer *)((long)local_20 + 1)) {
                swap(&IStack_c0 + (long)local_20 + 1,&IStack_c0 + (local_18 - (long)local_20));
                swap(&IStack_100 + (long)local_20 + 1,&IStack_100 + (local_18 - (long)local_20));
              }
              for (local_20 = (Integer *)0x0; (long)local_20 < local_18;
                  local_20 = (Integer *)((long)local_20 + 1)) {
                (&IStack_c0)[(long)local_20 + 1] = (&IStack_c0)[(long)local_20 + 1] + -1;
              }
              for (local_20 = (Integer *)0x0; (long)local_20 < local_18;
                  local_20 = (Integer *)((long)local_20 + 1)) {
                (&IStack_100)[(long)local_20 + 1] = (&IStack_100)[(long)local_20 + 1] + -1;
              }
            }
            gai_print_range(pre,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80,
                            in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
          }
        }
      }
      else {
        iVar1 = strcmp(local_1e8,"scalapack");
        if (((iVar1 == 0) || (iVar1 = strcmp(local_1e8,"tiled_irreg"), iVar1 == 0)) ||
           (iVar1 = strcmp(local_1e8,"tiled"), iVar1 == 0)) {
          pnga_nblock((Integer)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
          iVar1 = strcmp(local_1e8,"scalapack");
          if (iVar1 == 0) {
            printf("\nDistribution is ScaLAPACK\n");
          }
          else {
            iVar1 = strcmp(local_1e8,"tiled_irreg");
            if (iVar1 == 0) {
              printf("\nDistribution is Tiled Irregular\n");
            }
            else {
              iVar1 = strcmp(local_1e8,"tiled");
              if (iVar1 == 0) {
                printf("\nDistribution is Tiled\n");
              }
            }
          }
          printf("\n");
          printf("Number of blocks in each dimension: [");
          for (local_20 = (Integer *)0x0; (long)local_20 < local_18 + -1;
              local_20 = (Integer *)((long)local_20 + 1)) {
            printf("%ld,",local_288[(long)local_20]);
          }
          printf("%ld]\n\n",local_288[local_18 + -1]);
          pnga_get_proc_grid((Integer)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
          printf("Processor grid dimensions: [");
          for (local_20 = (Integer *)0x0; (long)local_20 < local_18 + -1;
              local_20 = (Integer *)((long)local_20 + 1)) {
            printf("%ld,",local_2c8[(long)local_20]);
          }
          printf("%ld]\n\n",local_288[local_18 + -1]);
          for (local_20 = (Integer *)0x0; (long)local_20 < IVar2;
              local_20 = (Integer *)((long)local_20 + 1)) {
            printf("Distribution on process %ld\n",local_20);
            pnga_get_proc_index(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                                in_stack_fffffffffffffca0);
            pnga_get_proc_index(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                                in_stack_fffffffffffffca0);
            lVar7 = 1;
            while (lVar7 != 0) {
              in_stack_fffffffffffffca0 = (Integer *)0x0;
              for (lVar4 = local_18 + -1; -1 < lVar4; lVar4 = lVar4 + -1) {
                in_stack_fffffffffffffca0 =
                     (Integer *)
                     ((long)in_stack_fffffffffffffca0 * local_288[lVar4] + local_348[lVar4]);
              }
              sprintf(local_168," idx: %ld Block=[",in_stack_fffffffffffffca0);
              pnga_distribution(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                                in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
              post = local_168;
              sVar5 = strlen(local_168);
              local_368 = post + sVar5;
              if (in_EDI == 0) {
                for (uVar6 = local_18 - 1; 0 < (long)uVar6; uVar6 = uVar6 + 1) {
                  sprintf(local_368,"%ld,",local_348[uVar6]);
                  sVar5 = strlen(local_368);
                  local_368 = local_368 + sVar5;
                }
                sprintf(local_368,"%ld]",local_348[0]);
                sVar5 = strlen(local_368);
                local_368 = local_368 + sVar5;
              }
              else {
                for (uVar6 = 0; (long)uVar6 < local_18 + -1; uVar6 = uVar6 + 1) {
                  sprintf(local_368,"%ld,",local_348[uVar6]);
                  sVar5 = strlen(local_368);
                  local_368 = local_368 + sVar5;
                }
                sprintf(local_368,"%ld]",local_348[local_18 + -1]);
                sVar5 = strlen(local_368);
                local_368 = local_368 + sVar5;
              }
              sprintf(local_368,"\t corresponds to array section: %d ",uVar6 & 0xffffffff);
              if (in_EDI == 0) {
                for (local_20 = (Integer *)0x0; (long)local_20 < local_18 / 2;
                    local_20 = (Integer *)((long)local_20 + 1)) {
                  swap(&IStack_c0 + (long)local_20 + 1,&IStack_c0 + (local_18 - (long)local_20));
                  swap(&IStack_100 + (long)local_20 + 1,&IStack_100 + (local_18 - (long)local_20));
                }
                for (local_20 = (Integer *)0x0; (long)local_20 < local_18;
                    local_20 = (Integer *)((long)local_20 + 1)) {
                  (&IStack_c0)[(long)local_20 + 1] = (&IStack_c0)[(long)local_20 + 1] + -1;
                }
                for (local_20 = (Integer *)0x0; (long)local_20 < local_18;
                    local_20 = (Integer *)((long)local_20 + 1)) {
                  (&IStack_100)[(long)local_20 + 1] = (&IStack_100)[(long)local_20 + 1] + -1;
                }
              }
              gai_print_range(pre,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80,
                              in_stack_fffffffffffffc78,post);
              local_348[0] = local_2c8[0] + local_348[0];
              for (in_stack_fffffffffffffca8 = 0; in_stack_fffffffffffffca8 < local_18;
                  in_stack_fffffffffffffca8 = in_stack_fffffffffffffca8 + 1) {
                if ((local_288[in_stack_fffffffffffffca8] <= local_348[in_stack_fffffffffffffca8])
                   && (in_stack_fffffffffffffca8 < local_18 + -1)) {
                  local_348[in_stack_fffffffffffffca8] = local_308[in_stack_fffffffffffffca8];
                  local_348[in_stack_fffffffffffffca8 + 1] =
                       local_2c8[in_stack_fffffffffffffca8 + 1] +
                       local_348[in_stack_fffffffffffffca8 + 1];
                }
              }
              if (local_288[local_18 + -1] <= local_348[local_18 + -1]) {
                lVar7 = 0;
              }
            }
            in_stack_fffffffffffffcb0 = 0;
          }
        }
        else {
          printf("\nData distribution type is unknown\n");
        }
      }
    }
    fflush(_stdout);
  }
  if (iVar8 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_print_distribution(int fstyle, Integer g_a)
{
Integer ndim, i, proc, type, nproc=pnga_nnodes();
Integer dims[MAXDIM], lo[MAXDIM], hi[MAXDIM];
char msg[100];
char ctype[128];
char *name;
int local_sync_begin,local_sync_end;

    local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if(local_sync_begin)pnga_sync();

    if(pnga_nodeid() ==0){
      pnga_inquire(g_a, &type, &ndim, dims);
      pnga_inquire_name(g_a, &name);
      printf("Array Handle=%d Name:'%s' ",(int)g_a, name);
      printf("Data Type:");
      switch(type){
        case C_DBL: printf("double"); break;
        case C_INT: printf("integer"); break;
        case C_DCPL: printf("double complex"); break;
        case C_SCPL: printf("float (single) complex"); break;
        case C_FLOAT: printf("float"); break; 
        case C_LONG: printf("long"); break; 
        case C_LONGLONG: printf("long long"); break; 
        default: pnga_error("ga_print_distribution: type not supported",type);
      }
      printf("\nArray Dimensions:");
      if(fstyle){
         for(i=0; i<ndim-1; i++)printf("%ldx",(long)dims[i]);
         printf("%ld\n",(long)dims[ndim-1]);
      }else{
         for(i=ndim-1; i>0; i--)printf("%ldx",(long)dims[i]);
         printf("%ld\n",(long)dims[0]);
      }

      /* print array range for every processor */
      
      pnga_get_distribution_type(g_a, ctype);
      if (!strcmp(ctype,"regular")) {
        for(proc = 0; proc < nproc; proc++){
          pnga_distribution(g_a,proc,lo,hi);
          sprintf(msg,"Process=%d\t owns array section: ",(int)proc);

          /* for C style need to swap and decremenent by 1 both arrays */
          if(!fstyle){
            for(i=0; i<ndim/2; i++){
              swap(lo+i,lo+ndim-i-1); 
              swap(hi+i,hi+ndim-i-1); 
            }
            for(i=0; i<ndim; i++)lo[i]--;
            for(i=0; i<ndim; i++)hi[i]--;
          }
          gai_print_range(msg,(int)ndim,lo,hi,"\n");
        }
      } else if (!strcmp(ctype,"block_cyclic")) {
        Integer nblocks[MAXDIM];
        Integer total, j;
        pnga_nblock(g_a,nblocks);
        printf("\nDistribution is block-cyclic\n");
        total = 1;
        for (i=0; i<ndim; i++) {
          total *= nblocks[i];
        }
        printf("\nTotal of %ld blocks on %ld processors\n",total,nproc);
        for (i=0; i<nproc; i++) {
          printf("Distribution on process %ld\n",i);
          for (j=i; j<total; j += nproc) {
            pnga_distribution(g_a,j,lo,hi);
            sprintf(msg,"  Block=%d\t corresponds to array section: ",(int)j);
            /* for C style need to swap and decremenent by 1 both arrays */
            if(!fstyle){
              for(i=0; i<ndim/2; i++){
                swap(lo+i,lo+ndim-i-1); 
                swap(hi+i,hi+ndim-i-1); 
              }
              for(i=0; i<ndim; i++)lo[i]--;
              for(i=0; i<ndim; i++)hi[i]--;
            }
            gai_print_range(msg,(int)ndim,lo,hi,"\n");
          }
        }
      } else if (!strcmp(ctype,"scalapack") ||
          !strcmp(ctype,"tiled_irreg") || !strcmp(ctype,"tiled")) {
        Integer nblocks[MAXDIM], proc_grid[MAXDIM], proc_idx[MAXDIM];
        Integer index[MAXDIM];
        Integer ok, j, idx;
        pnga_nblock(g_a,nblocks);
        char *ptr;
        if (!strcmp(ctype,"scalapack")) {
          printf("\nDistribution is ScaLAPACK\n");
        } else if (!strcmp(ctype,"tiled_irreg")) {
          printf("\nDistribution is Tiled Irregular\n");
        } else if (!strcmp(ctype,"tiled")) {
          printf("\nDistribution is Tiled\n");
        }

        printf("\n");
        printf("Number of blocks in each dimension: [");
        for (i=0; i<ndim-1; i++) printf("%ld,",nblocks[i]);
        printf("%ld]\n\n",nblocks[ndim-1]);

        pnga_get_proc_grid(g_a,proc_grid);
        printf("Processor grid dimensions: [");
        for (i=0; i<ndim-1; i++) printf("%ld,",proc_grid[i]);
        printf("%ld]\n\n",nblocks[ndim-1]);

        for (i=0; i<nproc; i++) {
          printf("Distribution on process %ld\n",i);
          pnga_get_proc_index(g_a,i,proc_idx);
          pnga_get_proc_index(g_a,i,index);
          ok = 1;
          while (ok) {
            /* find block index */
            idx = 0;
            for (j=ndim-1; j>=0; j--) {
              idx = idx*nblocks[j]+index[j];
            }
            sprintf(msg," idx: %ld Block=[",idx);
            pnga_distribution(g_a,idx,lo,hi);
            ptr = msg + strlen(msg);
            if (fstyle) {
              for (j=0; j<ndim-1; j++) {
                sprintf(ptr,"%ld,",index[j]);
                ptr += strlen(ptr);
              }
              sprintf(ptr,"%ld]",index[ndim-1]);
              ptr += strlen(ptr);
            } else {
              for (j=ndim-1; j>0; j++) {
                sprintf(ptr,"%ld,",index[j]);
                ptr += strlen(ptr);
              }
              sprintf(ptr,"%ld]",index[0]);
              ptr += strlen(ptr);
            }
            sprintf(ptr,"\t corresponds to array section: %d ",(int)j);
            /* for C style need to swap and decremenent by 1 both arrays */
            if(!fstyle){
              for(i=0; i<ndim/2; i++){
                swap(lo+i,lo+ndim-i-1); 
                swap(hi+i,hi+ndim-i-1); 
              }
              for(i=0; i<ndim; i++)lo[i]--;
              for(i=0; i<ndim; i++)hi[i]--;
            }
            gai_print_range(msg,(int)ndim,lo,hi,"\n");
            index[0] += proc_grid[0];
            for (j=0; j<ndim; j++) {
              if (index[j] >= nblocks[j] && j<ndim-1) {
                index[j] = proc_idx[j];
                index[j+1] += proc_grid[j+1];
              }
            }
            if (index[ndim-1] >= nblocks[ndim-1]) ok = 0;
          }
        }
      } else {
        printf("\nData distribution type is unknown\n");
      }
      fflush(stdout);
    }

    if(local_sync_end)pnga_sync();
}